

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

QVariant * __thiscall QTabBar::tabData(QTabBar *this,int index)

{
  Tab *pTVar1;
  QTabBarPrivate *in_RDI;
  Tab *tab;
  QTabBarPrivate *d;
  QTabBarPrivate *this_00;
  
  this_00 = in_RDI;
  d_func((QTabBar *)0x6ae8ec);
  pTVar1 = QTabBarPrivate::at(this_00,(int)((ulong)in_RDI >> 0x20));
  if (pTVar1 == (Tab *)0x0) {
    ::QVariant::QVariant((QVariant *)0x6ae92c);
  }
  else {
    ::QVariant::QVariant((QVariant *)in_RDI,(QVariant *)&pTVar1->data);
  }
  return (QVariant *)this_00;
}

Assistant:

QVariant QTabBar::tabData(int index) const
{
    Q_D(const QTabBar);
    if (const QTabBarPrivate::Tab *tab = d->at(index))
        return tab->data;
    return QVariant();
}